

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

bool __thiscall SQCompiler::Compile(SQCompiler *this,SQObjectPtr *o)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQFuncState *pSVar4;
  SQTable *pSVar5;
  SQTable *pSVar6;
  SQCOMPILERERROR p_Var7;
  SQVM *pSVar8;
  SQDelegable *pSVar9;
  int iVar10;
  SQObjectValue SVar11;
  SQInteger n;
  SQString *pSVar12;
  long lVar13;
  SQFunctionProto *pSVar14;
  SQChar *pSVar15;
  HSQUIRRELVM pSVar16;
  SQObject SVar17;
  SQFuncState funcstate;
  SQObject local_248;
  SQFuncState local_238;
  
  this->_debugline = 1;
  this->_debugop = 0;
  SQFuncState::SQFuncState(&local_238,this->_vm->_sharedstate,(SQFuncState *)0x0,ThrowError,this);
  SVar11.pString = SQString::Create(this->_vm->_sharedstate,"main",-1);
  SVar2 = local_238._name.super_SQObject._type;
  local_238._name.super_SQObject._type = OT_STRING;
  pSVar1 = &((SVar11.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &((local_238._name.super_SQObject._unVal.pTable)->super_SQDelegable).
              super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      pSVar9 = &(local_238._name.super_SQObject._unVal.pTable)->super_SQDelegable;
      local_238._name.super_SQObject._unVal.pString = SVar11.pString;
      (*(pSVar9->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
      SVar11 = local_238._name.super_SQObject._unVal;
    }
  }
  local_238._name.super_SQObject._unVal = SVar11;
  this->_fs = &local_238;
  SVar17 = SQFuncState::CreateString(&local_238,"this",-1);
  local_248._unVal = SVar17._unVal;
  local_248._type = SVar17._type;
  SQFuncState::AddParameter(&local_238,&local_248);
  pSVar4 = this->_fs;
  SVar17 = SQFuncState::CreateString(pSVar4,"vargv",-1);
  local_248._unVal = SVar17._unVal;
  local_248._type = SVar17._type;
  SQFuncState::AddParameter(pSVar4,&local_248);
  pSVar4 = this->_fs;
  pSVar4->_varparams = true;
  SVar2 = (pSVar4->_sourcename).super_SQObject._type;
  pSVar5 = (pSVar4->_sourcename).super_SQObject._unVal.pTable;
  pSVar6 = (this->_sourcename).super_SQObject._unVal.pTable;
  (pSVar4->_sourcename).super_SQObject._unVal.pTable = pSVar6;
  SVar3 = (this->_sourcename).super_SQObject._type;
  (pSVar4->_sourcename).super_SQObject._type = SVar3;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  n = SQFuncState::GetStackSize(this->_fs);
  iVar10 = _setjmp((__jmp_buf_tag *)this->_errorjmp);
  if (iVar10 == 0) {
    lVar13 = SQLexer::Lex(&this->_lex);
    this->_token = lVar13;
    while (0 < lVar13) {
      Statement(this,true);
      lVar13 = (this->_lex)._prevtoken;
      if ((lVar13 != 0x3b) && (lVar13 != 0x7d)) {
        OptionalSemicolon(this);
      }
      lVar13 = this->_token;
    }
    SQFuncState::SetStackSize(this->_fs,n);
    SQFuncState::AddLineInfos(this->_fs,(this->_lex)._currentline,this->_lineinfo,true);
    local_248._type = 0;
    local_248._4_4_ = 0xff17;
    SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_248);
    SQFuncState::SetStackSize(this->_fs,0);
    pSVar14 = SQFuncState::BuildProto(this->_fs);
    pSVar5 = (o->super_SQObject)._unVal.pTable;
    SVar2 = (o->super_SQObject)._type;
    (o->super_SQObject)._type = OT_FUNCPROTO;
    (o->super_SQObject)._unVal.pFunctionProto = pSVar14;
    pSVar1 = &(pSVar14->super_SQCollectable).super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  else {
    pSVar16 = this->_vm;
    if ((this->_raiseerror == true) &&
       (p_Var7 = pSVar16->_sharedstate->_compilererrorhandler, p_Var7 != (SQCOMPILERERROR)0x0)) {
      pSVar15 = "unknown";
      if ((this->_sourcename).super_SQObject._type == OT_STRING) {
        pSVar15 = ((this->_sourcename).super_SQObject._unVal.pString)->_val;
      }
      (*p_Var7)(pSVar16,this->_compilererror,pSVar15,(this->_lex)._currentline,
                (this->_lex)._currentcolumn);
      pSVar16 = this->_vm;
    }
    pSVar12 = SQString::Create(pSVar16->_sharedstate,this->_compilererror,-1);
    pSVar8 = this->_vm;
    pSVar5 = (pSVar8->_lasterror).super_SQObject._unVal.pTable;
    SVar2 = (pSVar8->_lasterror).super_SQObject._type;
    (pSVar8->_lasterror).super_SQObject._type = OT_STRING;
    (pSVar8->_lasterror).super_SQObject._unVal.pString = pSVar12;
    pSVar1 = &(pSVar12->super_SQRefCounted)._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                (pSVar5);
    }
  }
  SQFuncState::~SQFuncState(&local_238);
  return iVar10 == 0;
}

Assistant:

bool Compile(SQObjectPtr &o)
    {
        _debugline = 1;
        _debugop = 0;

        SQFuncState funcstate(_ss(_vm), NULL,ThrowError,this);
        funcstate._name = SQString::Create(_ss(_vm), _SC("main"));
        _fs = &funcstate;
        _fs->AddParameter(_fs->CreateString(_SC("this")));
        _fs->AddParameter(_fs->CreateString(_SC("vargv")));
        _fs->_varparams = true;
        _fs->_sourcename = _sourcename;
        SQInteger stacksize = _fs->GetStackSize();
        if(setjmp(_errorjmp) == 0) {
            Lex();
            while(_token > 0){
                Statement();
                if(_lex._prevtoken != _SC('}') && _lex._prevtoken != _SC(';')) OptionalSemicolon();
            }
            _fs->SetStackSize(stacksize);
            _fs->AddLineInfos(_lex._currentline, _lineinfo, true);
            _fs->AddInstruction(_OP_RETURN, 0xFF);
            _fs->SetStackSize(0);
            o =_fs->BuildProto();
#ifdef _DEBUG_DUMP
            _fs->Dump(_funcproto(o));
#endif
        }
        else {
            if(_raiseerror && _ss(_vm)->_compilererrorhandler) {
                _ss(_vm)->_compilererrorhandler(_vm, _compilererror, sq_type(_sourcename) == OT_STRING?_stringval(_sourcename):_SC("unknown"),
                    _lex._currentline, _lex._currentcolumn);
            }
            _vm->_lasterror = SQString::Create(_ss(_vm), _compilererror, -1);
            return false;
        }
        return true;
    }